

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

bool __thiscall QGroupBoxPrivate::shouldHandleKeyEvent(QGroupBoxPrivate *this,QKeyEvent *keyEvent)

{
  bool bVar1;
  QListSpecialMethodsBase<Qt::Key> *this_00;
  QPlatformTheme *pQVar2;
  QKeyEvent *in_RSI;
  QGroupBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QGroupBox *q;
  QList<Qt::Key> buttonPressKeys;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool local_45;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListSpecialMethodsBase<Qt::Key> *)q_func(in_RDI);
  bVar1 = QWidget::isEnabled((QWidget *)0x5a4a39);
  if (((!bVar1) || (bVar1 = QGroupBox::isCheckable((QGroupBox *)this_00), !bVar1)) ||
     (bVar1 = QKeyEvent::isAutoRepeat(in_RSI), bVar1)) {
    local_45 = false;
  }
  else {
    pQVar2 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_28,pQVar2,0x28);
    ::QVariant::value<QList<Qt::Key>>
              ((QVariant *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    ::QVariant::~QVariant(&local_28);
    QKeyEvent::key(in_RSI);
    local_45 = QListSpecialMethodsBase<Qt::Key>::contains<int>
                         (this_00,(int *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  in_stack_ffffffffffffff98));
    QList<Qt::Key>::~QList((QList<Qt::Key> *)0x5a4aeb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_45;
}

Assistant:

bool QGroupBoxPrivate::shouldHandleKeyEvent(const QKeyEvent *keyEvent) const
{
    Q_Q(const QGroupBox);

    if (!q->isEnabled() || !q->isCheckable() || keyEvent->isAutoRepeat())
        return false;

    const QList<Qt::Key> buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                           ->themeHint(QPlatformTheme::ButtonPressKeys)
                                           .value<QList<Qt::Key>>();
    return buttonPressKeys.contains(keyEvent->key());
}